

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Conn.cpp
# Opt level: O3

int __thiscall Conn::do_recv(Conn *this,ConnInfo *conn_info)

{
  char **ppcVar1;
  uint uVar2;
  int iVar3;
  char *__buf;
  ssize_t sVar4;
  uint *puVar5;
  const_iterator __pos;
  iterator iVar6;
  size_t sVar7;
  uint *puVar8;
  _Base_ptr p_Var9;
  uint *puVar10;
  int *piVar11;
  _Rb_tree<int,std::pair<int_const,ConnInfo>,std::_Select1st<std::pair<int_const,ConnInfo>>,std::less<int>,std::allocator<std::pair<int_const,ConnInfo>>>
  *this_00;
  uint uVar12;
  bool bVar13;
  tuple<> tStack_71;
  _Head_base<0UL,_const_int_&,_false> _Stack_70;
  ulong uStack_68;
  uint uStack_60;
  ConnInfo *pCStack_50;
  ssize_t sStack_48;
  char **ppcStack_40;
  uint local_38;
  
  ppcVar1 = &(conn_info->buf)._r_pos;
  __buf = (conn_info->buf)._r_pos;
  sVar7 = (long)ppcVar1 - (long)__buf;
  if (sVar7 == 0) {
    ppcStack_40 = (char **)0x10315d;
    do_recv((Conn *)conn_info);
    return -3;
  }
  ppcStack_40 = (char **)0x10312c;
  sVar4 = read(conn_info->fd,__buf,sVar7);
  uVar12 = (uint)sVar4;
  if (-1 < (int)uVar12) {
    if (uVar12 != 0) {
      ppcStack_40 = (char **)0x1031d3;
      local_38 = uVar12;
      fprintf(_stderr,"%s(%d)-<%s>: read done from fd: %d, total nbytes: %d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp"
              ,0x93,"do_recv",(ulong)(uint)conn_info->fd);
      ppcStack_40 = (char **)0x1031dc;
      fflush(_stderr);
      *ppcVar1 = *ppcVar1 + (uVar12 & 0x7fffffff);
      return 0;
    }
    ppcStack_40 = (char **)0x103195;
    fprintf(_stderr,"%s(%d)-<%s>: recv fd %d, close by client\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp"
            ,0x8d,"do_recv",(ulong)(uint)conn_info->fd);
    ppcStack_40 = (char **)0x10319e;
    fflush(_stderr);
    conn_info->readeof = true;
    return -1;
  }
  ppcStack_40 = (char **)0x103139;
  puVar5 = (uint *)__errno_location();
  puVar10 = (uint *)(ulong)*puVar5;
  if (*puVar5 == 0xb) {
    return 0;
  }
  ppcStack_40 = (char **)0x1031f3;
  do_recv();
  sVar7 = *(long *)(puVar10 + 0x20e) - (long)*(void **)(puVar10 + 0x210);
  pCStack_50 = conn_info;
  sStack_48 = sVar4;
  ppcStack_40 = ppcVar1;
  if (sVar7 == 0) {
    uVar12 = 0;
LAB_00103241:
    uStack_68 = 0x103273;
    uStack_60 = uVar12;
    fprintf(_stderr,"%s(%d)-<%s>: send fd: %d done, total nbytes: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp"
            ,0xaf,"do_send",(ulong)*puVar10);
    uStack_68 = 0x10327b;
    fflush(_stderr);
    puVar5 = (uint *)((ulong)uVar12 + *(long *)(puVar10 + 0x210));
    *(uint **)(puVar10 + 0x210) = puVar5;
    puVar8 = *(uint **)(puVar10 + 0x20e);
    if (*(uint **)(puVar10 + 0x20e) == puVar5) {
      puVar5 = puVar10 + 0xe;
      *(uint **)(puVar10 + 0x20e) = puVar5;
      *(uint **)(puVar10 + 0x210) = puVar5;
      puVar8 = puVar5;
    }
    if (((char)puVar10[0x212] == '\x01') && (puVar8 == puVar5)) {
      return -4;
    }
    return 0;
  }
  uStack_68 = 0x10321a;
  sVar4 = write(*puVar10,*(void **)(puVar10 + 0x210),sVar7);
  uVar12 = (uint)sVar4;
  if (-1 < (int)uVar12) goto LAB_00103241;
  uStack_68 = 0x103227;
  puVar5 = (uint *)__errno_location();
  uVar12 = *puVar5;
  if (uVar12 == 0xb) {
    return 0;
  }
  uStack_68 = 0x1032d5;
  do_send();
  uVar2 = puVar10[2];
  uStack_68 = (ulong)uVar2;
  if ((int)uVar12 <= (int)uVar2) {
    return uVar12 * 0xc + (int)*(undefined8 *)(puVar10 + 4);
  }
  this_00 = (_Rb_tree<int,std::pair<int_const,ConnInfo>,std::_Select1st<std::pair<int_const,ConnInfo>>,std::less<int>,std::allocator<std::pair<int_const,ConnInfo>>>
             *)(ulong)uVar12;
  piVar11 = (int *)(ulong)uVar2;
  _Stack_70._M_head_impl = (int *)0x1032f7;
  Epoll::get();
  p_Var9 = *(_Base_ptr *)(this_00 + 0x10);
  __pos._M_node = (_Base_ptr)(this_00 + 8);
  if (p_Var9 != (_Base_ptr)0x0) {
    iVar3 = *piVar11;
    iVar6._M_node = __pos._M_node;
    do {
      if (iVar3 <= (int)p_Var9[1]._M_color) {
        iVar6._M_node = p_Var9;
      }
      p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < iVar3];
    } while (p_Var9 != (_Base_ptr)0x0);
    bVar13 = iVar6._M_node != __pos._M_node;
    __pos._M_node = iVar6._M_node;
    if ((bVar13) && ((int)iVar6._M_node[1]._M_color <= iVar3)) goto LAB_00103354;
  }
  _Stack_70._M_head_impl = piVar11;
  iVar6 = std::
          _Rb_tree<int,std::pair<int_const,ConnInfo>,std::_Select1st<std::pair<int_const,ConnInfo>>,std::less<int>,std::allocator<std::pair<int_const,ConnInfo>>>
          ::
          _M_emplace_hint_unique<std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<>>
                    (this_00,__pos,(piecewise_construct_t *)&std::piecewise_construct,
                     (tuple<const_int_&> *)&_Stack_70,&tStack_71);
LAB_00103354:
  return (int)iVar6._M_node + 0x28;
}

Assistant:

int Conn::do_recv(ConnInfo *conn_info)
{
    Buff &buf = conn_info->buf;
    // LOG_PRINT("conn_info->buf: %p, conn_info->buf.left_size(): %lu", buf._buf, buf.left_size());
    if (buf.left_size() == 0)
    {
        LOG_PRINT("sock_fd: %d can read, but buf have no space to read!", conn_info->fd);
        return err_svr_recv_nospace;
    }

    int nrecv = read(conn_info->fd, buf._r_pos, buf.left_size());
    if (nrecv < 0)
    {
        if (errno != EAGAIN)    //也就是 EWOULDBLOCK
        {
            LOG_PRINT("recv fd %d occurs error, error %s", conn_info->fd, strerror(errno));
            exit(err_svr_recv_error);
        }
    }
    else if (nrecv == 0)
    {
        LOG_PRINT("recv fd %d, close by client", conn_info->fd);
        conn_info->readeof = true;
        return err_svr_recv_eof;
    }
    else
    {
        LOG_PRINT("read done from fd: %d, total nbytes: %d", conn_info->fd, nrecv);
        buf.set_r_pow(nrecv);
        return err_svr_recv_normal;
    }

    return err_svr_recv_normal;
}